

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O0

PhysicalIndex __thiscall
duckdb::BatchInsertGlobalState::MergeCollections
          (BatchInsertGlobalState *this,ClientContext *context,
          vector<duckdb::RowGroupBatchEntry,_true> *merge_collections,OptimisticDataWriter *writer)

{
  bool bVar1;
  const_iterator cVar2;
  reference pRVar3;
  CollectionMerger *in_RDX;
  CollectionMerger *in_RSI;
  ClientContext *in_RDI;
  RowGroupBatchEntry *entry;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::RowGroupBatchEntry,_true> *__range1;
  idx_t written_data;
  CollectionMerger merger;
  OptimisticDataWriter *in_stack_000003a0;
  CollectionMerger *in_stack_000003a8;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  DataTable *in_stack_ffffffffffffff50;
  PhysicalIndex PVar4;
  
  (**(code **)(*(long *)(in_RDI->config).set_variables._M_h._M_bucket_count + 0x80))();
  CollectionMerger::CollectionMerger(in_RSI,in_RDI,in_stack_ffffffffffffff50);
  PVar4.index = 0;
  cVar2 = ::std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>::
          begin((vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_> *)
                CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  ::std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>::end
            ((vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb::RowGroupBatchEntry_*,_std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<const_duckdb::RowGroupBatchEntry_*,_std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    if (!bVar1) break;
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_duckdb::RowGroupBatchEntry_*,_std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>_>
             ::operator*((__normal_iterator<const_duckdb::RowGroupBatchEntry_*,_std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>_>
                          *)&stack0xffffffffffffff90);
    CollectionMerger::AddCollection
              (in_RDX,PVar4,(RowGroupBatchType)((ulong)cVar2._M_current >> 0x38));
    PVar4.index = pRVar3->unflushed_memory + PVar4.index;
    __gnu_cxx::
    __normal_iterator<const_duckdb::RowGroupBatchEntry_*,_std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>_>
    ::operator++((__normal_iterator<const_duckdb::RowGroupBatchEntry_*,_std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>_>
                  *)&stack0xffffffffffffff90);
  }
  ::std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f);
  BatchMemoryManager::ReduceUnflushedMemory((BatchMemoryManager *)PVar4.index,(idx_t)in_RDX);
  PVar4 = CollectionMerger::Flush(in_stack_000003a8,in_stack_000003a0);
  CollectionMerger::~CollectionMerger((CollectionMerger *)0x18632e3);
  return (PhysicalIndex)PVar4.index;
}

Assistant:

PhysicalIndex BatchInsertGlobalState::MergeCollections(ClientContext &context,
                                                       const vector<RowGroupBatchEntry> &merge_collections,
                                                       OptimisticDataWriter &writer) {
	D_ASSERT(!merge_collections.empty());
	CollectionMerger merger(context, table.GetStorage());
	idx_t written_data = 0;
	for (auto &entry : merge_collections) {
		merger.AddCollection(entry.collection_index, RowGroupBatchType::NOT_FLUSHED);
		written_data += entry.unflushed_memory;
	}
	optimistically_written = true;
	memory_manager.ReduceUnflushedMemory(written_data);
	return merger.Flush(writer);
}